

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O3

int run_test_threadpool_cancel_random(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *loop;
  uv_loop_t *puVar2;
  long lVar3;
  undefined1 *extraout_RDX;
  int iVar4;
  uv_random_t *req_00;
  long lVar5;
  random_info req;
  uv_timer_t uStack_980;
  uv_work_t auStack_8e8 [16];
  uv_loop_t *puStack_e0;
  
  saturate_threadpool();
  loop = uv_default_loop();
  req_00 = (uv_random_t *)&stack0xffffffffffffff50;
  lVar3 = 1;
  puVar2 = loop;
  iVar1 = uv_random(loop,req_00,&stack0xffffffffffffffe0,1,0,nop_random_cb);
  iVar4 = (int)req_00;
  if (iVar1 == 0) {
    puVar2 = (uv_loop_t *)&stack0xffffffffffffff50;
    iVar1 = uv_cancel((uv_req_t *)puVar2);
    if (iVar1 != 0) goto LAB_00173839;
    if (done_cb_called != 0) goto LAB_0017383e;
    lVar5 = 0;
    do {
      uv_sem_post((uv_sem_t *)((long)pause_sems + lVar5));
      lVar5 = lVar5 + 0x20;
    } while (lVar5 != 0x80);
    iVar4 = 0;
    puVar2 = loop;
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00173843;
    if (done_cb_called != 1) goto LAB_00173848;
    loop = uv_default_loop();
    uv_walk(loop,close_walk_cb,(void *)0x0);
    iVar4 = 0;
    uv_run(loop,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_threadpool_cancel_random_cold_1();
LAB_00173839:
    run_test_threadpool_cancel_random_cold_2();
LAB_0017383e:
    run_test_threadpool_cancel_random_cold_3();
LAB_00173843:
    run_test_threadpool_cancel_random_cold_4();
LAB_00173848:
    run_test_threadpool_cancel_random_cold_5();
  }
  run_test_threadpool_cancel_random_cold_6();
  if (iVar4 == -0x7d) {
    if ((undefined1 *)((long)&puVar2->wq_mutex + 8) != extraout_RDX) goto LAB_00173877;
    if (lVar3 == 1) {
      done_cb_called = done_cb_called + 1;
      return extraout_EAX;
    }
  }
  else {
    nop_random_cb_cold_1();
LAB_00173877:
    nop_random_cb_cold_2();
  }
  nop_random_cb_cold_3();
  puStack_e0 = loop;
  puVar2 = uv_default_loop();
  saturate_threadpool();
  lVar3 = 0;
  do {
    iVar1 = uv_queue_work(puVar2,(uv_work_t *)((long)auStack_8e8[0].reserved + lVar3 + -0x10),
                          work2_cb,done2_cb);
    if (iVar1 != 0) {
      run_test_threadpool_cancel_work_cold_1();
      goto LAB_00173993;
    }
    lVar3 = lVar3 + 0x80;
  } while (lVar3 != 0x800);
  iVar1 = uv_timer_init(puVar2,&uStack_980);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(&uStack_980,timer_cb,10,0);
    if (iVar1 != 0) goto LAB_00173998;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0017399d;
    if (timer_cb_called != 1) goto LAB_001739a2;
    if (done2_cb_called == 0x10) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001739ac;
    }
  }
  else {
LAB_00173993:
    run_test_threadpool_cancel_work_cold_2();
LAB_00173998:
    run_test_threadpool_cancel_work_cold_3();
LAB_0017399d:
    run_test_threadpool_cancel_work_cold_4();
LAB_001739a2:
    run_test_threadpool_cancel_work_cold_5();
  }
  run_test_threadpool_cancel_work_cold_6();
LAB_001739ac:
  run_test_threadpool_cancel_work_cold_7();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
          ,0x75,"0 && \"work2_cb called\"");
  abort();
}

Assistant:

TEST_IMPL(threadpool_cancel_random) {
  struct random_info req;
  uv_loop_t* loop;

  saturate_threadpool();
  loop = uv_default_loop();
  ASSERT(0 == uv_random(loop,
                        &req.random_req,
                        &req.buf,
                        sizeof(req.buf),
                        0,
                        nop_random_cb));
  ASSERT(0 == uv_cancel((uv_req_t*) &req));
  ASSERT(0 == done_cb_called);
  unblock_threadpool();
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(1 == done_cb_called);

  MAKE_VALGRIND_HAPPY();
  return 0;
}